

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O2

int __thiscall jpgd::jpeg_decoder::begin_decoding(jpeg_decoder *this)

{
  int iVar1;
  
  if (this->m_ready_flag == false) {
    if (this->m_error_code != JPGD_SUCCESS) {
      return -1;
    }
    iVar1 = _setjmp((__jmp_buf_tag *)this);
    if (iVar1 != 0) {
      return -1;
    }
    decode_start(this);
    this->m_ready_flag = true;
  }
  return 0;
}

Assistant:

int jpeg_decoder::begin_decoding()
{
  if (m_ready_flag)
    return JPGD_SUCCESS;

  if (m_error_code)
    return JPGD_FAILED;

  if (setjmp(m_jmp_state))
    return JPGD_FAILED;

  decode_start();

  m_ready_flag = true;

  return JPGD_SUCCESS;
}